

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O3

ExtensionRepository *
duckdb::ExtensionRepository::GetDefaultRepository(optional_ptr<duckdb::DBConfig,_true> config)

{
  DBConfig *in_RSI;
  ExtensionRepository *in_RDI;
  optional_ptr<duckdb::DBConfig,_true> local_38;
  string local_30;
  
  if ((in_RSI != (DBConfig *)0x0) &&
     (local_38.ptr = in_RSI, optional_ptr<duckdb::DBConfig,_true>::CheckValid(&local_38),
     ((local_38.ptr)->options).custom_extension_repo._M_string_length != 0)) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,anon_var_dwarf_63f17de + 9);
    optional_ptr<duckdb::DBConfig,_true>::CheckValid(&local_38);
    ExtensionRepository(in_RDI,&local_30,&((local_38.ptr)->options).custom_extension_repo);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return in_RDI;
    }
    operator_delete(local_30._M_dataplus._M_p);
    return in_RDI;
  }
  GetCoreRepository();
  return in_RDI;
}

Assistant:

ExtensionRepository ExtensionRepository::GetDefaultRepository(optional_ptr<DBConfig> config) {
	if (config && !config->options.custom_extension_repo.empty()) {
		return ExtensionRepository("", config->options.custom_extension_repo);
	}

	return GetCoreRepository();
}